

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cpp
# Opt level: O0

void __thiscall FFT_Multiplies_Test::TestBody(FFT_Multiplies_Test *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  char *message;
  AssertHelper local_c0;
  Message local_b8;
  vector<long_long,_std::allocator<long_long>_> local_b0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  vector<long_long,_std::allocator<long_long>_> want;
  int local_68;
  int j_1;
  int j;
  vector<long_long,_std::allocator<long_long>_> p2;
  allocator<long_long> local_31;
  undefined1 local_30 [8];
  vector<long_long,_std::allocator<long_long>_> p1;
  int i;
  FFT_Multiplies_Test *this_local;
  
  for (p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < 0x1e;
      p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    iVar2 = rand();
    std::allocator<long_long>::allocator(&local_31);
    std::vector<long_long,_std::allocator<long_long>_>::vector
              ((vector<long_long,_std::allocator<long_long>_> *)local_30,
               (long)(iVar2 + 0x1e + (iVar2 / 0x1e) * -0x1e),&local_31);
    std::allocator<long_long>::~allocator(&local_31);
    iVar2 = rand();
    std::allocator<long_long>::allocator((allocator<long_long> *)((long)&j_1 + 3));
    std::vector<long_long,_std::allocator<long_long>_>::vector
              ((vector<long_long,_std::allocator<long_long>_> *)&j,
               (long)(iVar2 + 0x1e + (iVar2 / 0x1e) * -0x1e),
               (allocator<long_long> *)((long)&j_1 + 3));
    std::allocator<long_long>::~allocator((allocator<long_long> *)((long)&j_1 + 3));
    for (local_68 = 0;
        sVar3 = std::vector<long_long,_std::allocator<long_long>_>::size
                          ((vector<long_long,_std::allocator<long_long>_> *)local_30),
        (ulong)(long)local_68 < sVar3; local_68 = local_68 + 1) {
      iVar2 = rand();
      pvVar4 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                         ((vector<long_long,_std::allocator<long_long>_> *)local_30,(long)local_68);
      *pvVar4 = (long)(iVar2 % 20000000 + -10000000);
    }
    for (want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        sVar3 = std::vector<long_long,_std::allocator<long_long>_>::size
                          ((vector<long_long,_std::allocator<long_long>_> *)&j),
        (ulong)(long)want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_ < sVar3;
        want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      iVar2 = rand();
      pvVar4 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                         ((vector<long_long,_std::allocator<long_long>_> *)&j,
                          (long)want.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      *pvVar4 = (long)(iVar2 % 20000000 + -10000000);
    }
    multiplyNaive((vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,
                  (vector<long_long,_std::allocator<long_long>_> *)local_30,
                  (vector<long_long,_std::allocator<long_long>_> *)&j);
    multiplyPolynomials(&local_b0,(vector<long_long,_std::allocator<long_long>_> *)local_30,
                        (vector<long_long,_std::allocator<long_long>_> *)&j);
    testing::internal::EqHelper<false>::
    Compare<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
              ((EqHelper<false> *)local_98,"want","multiplyPolynomials(p1, p2)",
               (vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,&local_b0);
    std::vector<long_long,_std::allocator<long_long>_>::~vector(&local_b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_98);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/numerical/fft_test.cpp"
                 ,0x36,message);
      testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      testing::Message::~Message(&local_b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    std::vector<long_long,_std::allocator<long_long>_>::~vector
              ((vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_);
    std::vector<long_long,_std::allocator<long_long>_>::~vector
              ((vector<long_long,_std::allocator<long_long>_> *)&j);
    std::vector<long_long,_std::allocator<long_long>_>::~vector
              ((vector<long_long,_std::allocator<long_long>_> *)local_30);
  }
  return;
}

Assistant:

TEST(FFT, Multiplies) {
    rep(i, 0, 30) {
        vector<ll> p1(30 + rand() % 30), p2(30 + rand() % 30);
        rep(j, 0, p1.size()) p1[j] = rand() % 20000000 - 10000000;
        rep(j, 0, p2.size()) p2[j] = rand() % 20000000 - 10000000;
        vector<ll> want = multiplyNaive(p1, p2);
        EXPECT_EQ(want, multiplyPolynomials(p1, p2));
    }
}